

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

void copywithendian(char *dest,char *src,int size,int islittle)

{
  char *pcVar1;
  long lVar2;
  
  if (islittle != 1) {
    pcVar1 = dest + ((long)size - 1);
    for (lVar2 = 0; size != (int)lVar2; lVar2 = lVar2 + 1) {
      *pcVar1 = src[lVar2];
      pcVar1 = pcVar1 + -1;
    }
    return;
  }
  memcpy(dest,src,(long)size);
  return;
}

Assistant:

static void copywithendian (char *dest, const char *src,
                            int size, int islittle) {
  if (islittle == nativeendian.little)
    memcpy(dest, src, size);
  else {
    dest += size - 1;
    while (size-- != 0)
      *(dest--) = *(src++);
  }
}